

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O1

void llama_sampler_xtc_reset(llama_sampler *smpl)

{
  llama_sampler_context_t pvVar1;
  uint32_t uVar2;
  long lVar3;
  ulong uVar4;
  
  pvVar1 = smpl->ctx;
  uVar2 = get_rng_seed(*(uint32_t *)((long)pvVar1 + 0x10));
  *(uint32_t *)((long)pvVar1 + 0x14) = uVar2;
  uVar4 = (ulong)uVar2;
  *(ulong *)((long)pvVar1 + 0x18) = uVar4;
  lVar3 = 4;
  do {
    uVar4 = (ulong)((((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar3) - 3);
    *(ulong *)((long)pvVar1 + lVar3 * 8) = uVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x273);
  *(undefined8 *)((long)pvVar1 + 0x1398) = 0x270;
  return;
}

Assistant:

static void llama_sampler_xtc_reset(struct llama_sampler * smpl) {
    auto * ctx = (llama_sampler_xtc *) smpl->ctx;
    ctx->seed_cur = get_rng_seed(ctx->seed);
    ctx->rng.seed(ctx->seed_cur);
}